

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O0

void __thiscall
highwayhash::SSE41::HHStateSSE41::AppendAndUpdate
          (HHStateSSE41 *this,char *from,size_t size_mod32,char *buffer,size_t buffer_valid)

{
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  HHStateSSE41 *in_RDI;
  ulong in_R8;
  size_t i_1;
  size_t i;
  HHPacket tmp;
  ulong local_90;
  ulong local_88;
  char local_80 [40];
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  for (local_88 = 0; local_88 < local_58; local_88 = local_88 + 1) {
    local_80[local_88] = *(char *)(local_50 + local_88);
  }
  for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
    local_80[local_58 + local_90] = *(char *)(local_40 + local_90);
  }
  Update(in_RDI,(HHPacket *)local_80);
  return;
}

Assistant:

HH_INLINE void AppendAndUpdate(const char* HH_RESTRICT from,
                                 const size_t size_mod32,
                                 const char* HH_RESTRICT buffer,
                                 const size_t buffer_valid) {
    HH_ALIGNAS(32) HHPacket tmp;
    for (size_t i = 0; i < buffer_valid; ++i) {
      tmp[i] = buffer[i];
    }
    for (size_t i = 0; i < size_mod32; ++i) {
      tmp[buffer_valid + i] = from[i];
    }
    Update(tmp);
  }